

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

bool __thiscall SGParser::Generator::Production::RHSEquals(Production *this,Production *right)

{
  Production *right_local;
  Production *this_local;
  
  if (this->pRight == right->pRight) {
    this_local._7_1_ = true;
  }
  else if (this->Length == right->Length) {
    this_local._7_1_ =
         std::equal<unsigned_int*,unsigned_int*>
                   (this->pRight + 1,this->pRight + (ulong)this->Length + 1,right->pRight + 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Production::RHSEquals(const Production& right) const noexcept {
    if (pRight == right.pRight)
        return true;
    else if (Length != right.Length)
        return false;
    return std::equal(pRight + 1u, pRight + 1u + Length, right.pRight + 1u);
}